

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxsolver.hpp
# Opt level: O3

void __thiscall
soplex::
SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::clearUpdateVecs(SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  *this)

{
  UpdateVector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pUVar1;
  cpp_dec_float<200U,_int,_void> *pcVar2;
  
  pUVar1 = this->theFvec;
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::clear(&pUVar1->thedelta);
  (pUVar1->theval).m_backend.fpclass = cpp_dec_float_finite;
  (pUVar1->theval).m_backend.prec_elem = 0x1c;
  (pUVar1->theval).m_backend.data._M_elems[0] = 0;
  (pUVar1->theval).m_backend.data._M_elems[1] = 0;
  pcVar2 = &(pUVar1->theval).m_backend;
  (pcVar2->data)._M_elems[2] = 0;
  (pcVar2->data)._M_elems[3] = 0;
  pcVar2 = &(pUVar1->theval).m_backend;
  (pcVar2->data)._M_elems[4] = 0;
  (pcVar2->data)._M_elems[5] = 0;
  pcVar2 = &(pUVar1->theval).m_backend;
  (pcVar2->data)._M_elems[6] = 0;
  (pcVar2->data)._M_elems[7] = 0;
  pcVar2 = &(pUVar1->theval).m_backend;
  (pcVar2->data)._M_elems[8] = 0;
  (pcVar2->data)._M_elems[9] = 0;
  pcVar2 = &(pUVar1->theval).m_backend;
  (pcVar2->data)._M_elems[10] = 0;
  (pcVar2->data)._M_elems[0xb] = 0;
  pcVar2 = &(pUVar1->theval).m_backend;
  (pcVar2->data)._M_elems[0xc] = 0;
  (pcVar2->data)._M_elems[0xd] = 0;
  pcVar2 = &(pUVar1->theval).m_backend;
  (pcVar2->data)._M_elems[0xe] = 0;
  (pcVar2->data)._M_elems[0xf] = 0;
  pcVar2 = &(pUVar1->theval).m_backend;
  (pcVar2->data)._M_elems[0x10] = 0;
  (pcVar2->data)._M_elems[0x11] = 0;
  pcVar2 = &(pUVar1->theval).m_backend;
  (pcVar2->data)._M_elems[0x12] = 0;
  (pcVar2->data)._M_elems[0x13] = 0;
  pcVar2 = &(pUVar1->theval).m_backend;
  (pcVar2->data)._M_elems[0x14] = 0;
  (pcVar2->data)._M_elems[0x15] = 0;
  pcVar2 = &(pUVar1->theval).m_backend;
  (pcVar2->data)._M_elems[0x16] = 0;
  (pcVar2->data)._M_elems[0x17] = 0;
  pcVar2 = &(pUVar1->theval).m_backend;
  (pcVar2->data)._M_elems[0x18] = 0;
  (pcVar2->data)._M_elems[0x19] = 0;
  pcVar2 = &(pUVar1->theval).m_backend;
  (pcVar2->data)._M_elems[0x1a] = 0;
  (pcVar2->data)._M_elems[0x1b] = 0;
  *(undefined8 *)((long)(pUVar1->theval).m_backend.data._M_elems + 0x6d) = 0;
  pUVar1 = this->thePvec;
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::clear(&pUVar1->thedelta);
  (pUVar1->theval).m_backend.fpclass = cpp_dec_float_finite;
  (pUVar1->theval).m_backend.prec_elem = 0x1c;
  (pUVar1->theval).m_backend.data._M_elems[0] = 0;
  (pUVar1->theval).m_backend.data._M_elems[1] = 0;
  pcVar2 = &(pUVar1->theval).m_backend;
  (pcVar2->data)._M_elems[2] = 0;
  (pcVar2->data)._M_elems[3] = 0;
  pcVar2 = &(pUVar1->theval).m_backend;
  (pcVar2->data)._M_elems[4] = 0;
  (pcVar2->data)._M_elems[5] = 0;
  pcVar2 = &(pUVar1->theval).m_backend;
  (pcVar2->data)._M_elems[6] = 0;
  (pcVar2->data)._M_elems[7] = 0;
  pcVar2 = &(pUVar1->theval).m_backend;
  (pcVar2->data)._M_elems[8] = 0;
  (pcVar2->data)._M_elems[9] = 0;
  pcVar2 = &(pUVar1->theval).m_backend;
  (pcVar2->data)._M_elems[10] = 0;
  (pcVar2->data)._M_elems[0xb] = 0;
  pcVar2 = &(pUVar1->theval).m_backend;
  (pcVar2->data)._M_elems[0xc] = 0;
  (pcVar2->data)._M_elems[0xd] = 0;
  pcVar2 = &(pUVar1->theval).m_backend;
  (pcVar2->data)._M_elems[0xe] = 0;
  (pcVar2->data)._M_elems[0xf] = 0;
  pcVar2 = &(pUVar1->theval).m_backend;
  (pcVar2->data)._M_elems[0x10] = 0;
  (pcVar2->data)._M_elems[0x11] = 0;
  pcVar2 = &(pUVar1->theval).m_backend;
  (pcVar2->data)._M_elems[0x12] = 0;
  (pcVar2->data)._M_elems[0x13] = 0;
  pcVar2 = &(pUVar1->theval).m_backend;
  (pcVar2->data)._M_elems[0x14] = 0;
  (pcVar2->data)._M_elems[0x15] = 0;
  pcVar2 = &(pUVar1->theval).m_backend;
  (pcVar2->data)._M_elems[0x16] = 0;
  (pcVar2->data)._M_elems[0x17] = 0;
  pcVar2 = &(pUVar1->theval).m_backend;
  (pcVar2->data)._M_elems[0x18] = 0;
  (pcVar2->data)._M_elems[0x19] = 0;
  pcVar2 = &(pUVar1->theval).m_backend;
  (pcVar2->data)._M_elems[0x1a] = 0;
  (pcVar2->data)._M_elems[0x1b] = 0;
  *(undefined8 *)((long)(pUVar1->theval).m_backend.data._M_elems + 0x6d) = 0;
  pUVar1 = this->theCoPvec;
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::clear(&pUVar1->thedelta);
  (pUVar1->theval).m_backend.fpclass = cpp_dec_float_finite;
  (pUVar1->theval).m_backend.prec_elem = 0x1c;
  (pUVar1->theval).m_backend.data._M_elems[0] = 0;
  (pUVar1->theval).m_backend.data._M_elems[1] = 0;
  pcVar2 = &(pUVar1->theval).m_backend;
  (pcVar2->data)._M_elems[2] = 0;
  (pcVar2->data)._M_elems[3] = 0;
  pcVar2 = &(pUVar1->theval).m_backend;
  (pcVar2->data)._M_elems[4] = 0;
  (pcVar2->data)._M_elems[5] = 0;
  pcVar2 = &(pUVar1->theval).m_backend;
  (pcVar2->data)._M_elems[6] = 0;
  (pcVar2->data)._M_elems[7] = 0;
  pcVar2 = &(pUVar1->theval).m_backend;
  (pcVar2->data)._M_elems[8] = 0;
  (pcVar2->data)._M_elems[9] = 0;
  pcVar2 = &(pUVar1->theval).m_backend;
  (pcVar2->data)._M_elems[10] = 0;
  (pcVar2->data)._M_elems[0xb] = 0;
  pcVar2 = &(pUVar1->theval).m_backend;
  (pcVar2->data)._M_elems[0xc] = 0;
  (pcVar2->data)._M_elems[0xd] = 0;
  pcVar2 = &(pUVar1->theval).m_backend;
  (pcVar2->data)._M_elems[0xe] = 0;
  (pcVar2->data)._M_elems[0xf] = 0;
  pcVar2 = &(pUVar1->theval).m_backend;
  (pcVar2->data)._M_elems[0x10] = 0;
  (pcVar2->data)._M_elems[0x11] = 0;
  pcVar2 = &(pUVar1->theval).m_backend;
  (pcVar2->data)._M_elems[0x12] = 0;
  (pcVar2->data)._M_elems[0x13] = 0;
  pcVar2 = &(pUVar1->theval).m_backend;
  (pcVar2->data)._M_elems[0x14] = 0;
  (pcVar2->data)._M_elems[0x15] = 0;
  pcVar2 = &(pUVar1->theval).m_backend;
  (pcVar2->data)._M_elems[0x16] = 0;
  (pcVar2->data)._M_elems[0x17] = 0;
  pcVar2 = &(pUVar1->theval).m_backend;
  (pcVar2->data)._M_elems[0x18] = 0;
  (pcVar2->data)._M_elems[0x19] = 0;
  pcVar2 = &(pUVar1->theval).m_backend;
  (pcVar2->data)._M_elems[0x1a] = 0;
  (pcVar2->data)._M_elems[0x1b] = 0;
  *(undefined8 *)((long)(pUVar1->theval).m_backend.data._M_elems + 0x6d) = 0;
  this->solveVector2 =
       (SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        *)0x0;
  this->solveVector3 =
       (SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        *)0x0;
  this->coSolveVector2 =
       (SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        *)0x0;
  this->coSolveVector3 =
       (SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        *)0x0;
  return;
}

Assistant:

void SPxSolverBase<R>::clearUpdateVecs(void)
   {
      theFvec->clearUpdate();
      thePvec->clearUpdate();
      theCoPvec->clearUpdate();
      solveVector2 = nullptr;
      solveVector3 = nullptr;
      coSolveVector2 = nullptr;
      coSolveVector3 = nullptr;
   }